

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_filter.cpp
# Opt level: O2

void __thiscall duckdb::DynamicFilterData::SetValue(DynamicFilterData *this,Value *val)

{
  pointer this_00;
  ConstantFilter *pCVar1;
  
  if (val->is_null != false) {
    return;
  }
  ::std::mutex::lock(&this->lock);
  this_00 = unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>,_true>::
            operator->(&this->filter);
  pCVar1 = TableFilter::Cast<duckdb::ConstantFilter>(&this_00->super_TableFilter);
  Value::operator=(&pCVar1->constant,val);
  this->initialized = true;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void DynamicFilterData::SetValue(Value val) {
	if (val.IsNull()) {
		return;
	}
	lock_guard<mutex> l(lock);
	filter->Cast<ConstantFilter>().constant = std::move(val);
	initialized = true;
}